

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# concavity.cpp
# Opt level: O3

void __thiscall
ConvexDecomposition::CTri::addWeighted
          (CTri *this,WpointVector *list,ConvexDecompInterface *callback)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  value_type local_90;
  value_type local_80;
  value_type local_70;
  value_type local_60;
  value_type local_50;
  value_type local_40;
  
  local_40.mPoint.x = (this->mP1).x;
  local_40.mPoint.y = (this->mP1).y;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_40.mPoint._0_8_;
  local_70.mWeight = this->mC1;
  local_40.mPoint.z = (this->mP1).z;
  local_50.mPoint.x = (this->mP2).x;
  local_50.mPoint.y = (this->mP2).y;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_50.mPoint._0_8_;
  local_80.mWeight = this->mC2;
  local_50.mPoint.z = (this->mP2).z;
  local_60.mPoint.x = (this->mP3).x;
  local_60.mPoint.y = (this->mP3).y;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = local_60.mPoint._0_8_;
  local_90.mWeight = this->mC3;
  local_60.mPoint.z = (this->mP3).z;
  local_80.mPoint.z = ((this->mNear2).z - local_50.mPoint.z) * 4.0 + local_50.mPoint.z;
  uVar1 = (this->mNear1).x;
  uVar4 = (this->mNear1).y;
  auVar15._4_4_ = uVar4;
  auVar15._0_4_ = uVar1;
  auVar15._8_8_ = 0;
  local_70.mPoint.z = ((this->mNear1).z - local_40.mPoint.z) * 4.0 + local_40.mPoint.z;
  local_90.mPoint.z = local_60.mPoint.z + ((this->mNear3).z - local_60.mPoint.z) * 4.0;
  auVar7 = vsubps_avx(auVar15,auVar11);
  auVar12._0_4_ = auVar7._0_4_ * 4.0 + (float)local_40.mPoint.x;
  auVar12._4_4_ = auVar7._4_4_ * 4.0 + (float)local_40.mPoint.y;
  auVar12._8_4_ = auVar7._8_4_ * 4.0 + 0.0;
  auVar12._12_4_ = auVar7._12_4_ * 4.0 + 0.0;
  local_70.mPoint._0_8_ = vmovlps_avx(auVar12);
  uVar2 = (this->mNear2).x;
  uVar5 = (this->mNear2).y;
  auVar7._4_4_ = uVar5;
  auVar7._0_4_ = uVar2;
  auVar7._8_8_ = 0;
  auVar7 = vsubps_avx(auVar7,auVar13);
  auVar8._0_4_ = (float)local_50.mPoint.x + auVar7._0_4_ * 4.0;
  auVar8._4_4_ = (float)local_50.mPoint.y + auVar7._4_4_ * 4.0;
  auVar8._8_4_ = auVar7._8_4_ * 4.0 + 0.0;
  auVar8._12_4_ = auVar7._12_4_ * 4.0 + 0.0;
  local_80.mPoint._0_8_ = vmovlps_avx(auVar8);
  uVar3 = (this->mNear3).x;
  uVar6 = (this->mNear3).y;
  auVar9._4_4_ = uVar6;
  auVar9._0_4_ = uVar3;
  auVar9._8_8_ = 0;
  auVar7 = vsubps_avx(auVar9,auVar14);
  auVar10._0_4_ = (float)local_60.mPoint.x + auVar7._0_4_ * 4.0;
  auVar10._4_4_ = (float)local_60.mPoint.y + auVar7._4_4_ * 4.0;
  auVar10._8_4_ = auVar7._8_4_ * 4.0 + 0.0;
  auVar10._12_4_ = auVar7._12_4_ * 4.0 + 0.0;
  local_90.mPoint._0_8_ = vmovlps_avx(auVar10);
  local_60.mWeight = local_90.mWeight;
  local_50.mWeight = local_80.mWeight;
  local_40.mWeight = local_70.mWeight;
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_40);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_50);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_60);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_70);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_80);
  std::vector<ConvexDecomposition::Wpoint,_std::allocator<ConvexDecomposition::Wpoint>_>::push_back
            (list,&local_90);
  return;
}

Assistant:

void addWeighted(WpointVector &list,ConvexDecompInterface *callback)
  {

    Wpoint p1(mP1,mC1);
    Wpoint p2(mP2,mC2);
    Wpoint p3(mP3,mC3);

		Vector3d d1 = mNear1 - mP1;
		Vector3d d2 = mNear2 - mP2;
		Vector3d d3 = mNear3 - mP3;

		d1*=WSCALE;
		d2*=WSCALE;
		d3*=WSCALE;

		d1 = d1 + mP1;
		d2 = d2 + mP2;
 	  d3 = d3 + mP3;

    Wpoint p4(d1,mC1);
    Wpoint p5(d2,mC2);
    Wpoint p6(d3,mC3);

    list.push_back(p1);
    list.push_back(p2);
    list.push_back(p3);

    list.push_back(p4);
    list.push_back(p5);
    list.push_back(p6);

#if 0
		callback->ConvexDebugPoint(mP1.Ptr(),0.01f,0x00FF00);
		callback->ConvexDebugPoint(mP2.Ptr(),0.01f,0x00FF00);
		callback->ConvexDebugPoint(mP3.Ptr(),0.01f,0x00FF00);
		callback->ConvexDebugPoint(d1.Ptr(),0.01f,0xFF0000);
		callback->ConvexDebugPoint(d2.Ptr(),0.01f,0xFF0000);
		callback->ConvexDebugPoint(d3.Ptr(),0.01f,0xFF0000);

		callback->ConvexDebugTri(mP1.Ptr(), d1.Ptr(),  d1.Ptr(),0x00FF00);
		callback->ConvexDebugTri(mP2.Ptr(), d2.Ptr(),  d2.Ptr(),0x00FF00);
		callback->ConvexDebugTri(mP3.Ptr(), d3.Ptr(),  d3.Ptr(),0x00FF00);

		Vector3d np1 = mP1 + mNormal*0.05f;
		Vector3d np2 = mP2 + mNormal*0.05f;
		Vector3d np3 = mP3 + mNormal*0.05f;

		callback->ConvexDebugTri(mP1.Ptr(), np1.Ptr(), np1.Ptr(), 0xFF00FF );
		callback->ConvexDebugTri(mP2.Ptr(), np2.Ptr(), np2.Ptr(), 0xFF00FF );
		callback->ConvexDebugTri(mP3.Ptr(), np3.Ptr(), np3.Ptr(), 0xFF00FF );

		callback->ConvexDebugPoint( np1.Ptr(), 0.01F, 0XFF00FF );
		callback->ConvexDebugPoint( np2.Ptr(), 0.01F, 0XFF00FF );
		callback->ConvexDebugPoint( np3.Ptr(), 0.01F, 0XFF00FF );

#endif



  }